

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O3

float Tim_ManGetCiArrival(Tim_Man_t *p,int iCi)

{
  float fVar1;
  uint uVar2;
  Tim_Obj_t *pTVar3;
  int *piVar4;
  Tim_Obj_t *pTVar5;
  int iVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  
  if (p->nCis <= iCi) {
    __assert_fail("i < p->nCis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/tim/timInt.h"
                  ,0x5d,"Tim_Obj_t *Tim_ManCi(Tim_Man_t *, int)");
  }
  pTVar3 = p->pCis;
  iVar6 = p->fUseTravId;
  if (iVar6 == 0) {
    iVar8 = p->nTravIds;
  }
  else {
    iVar8 = p->nTravIds;
    if (pTVar3[iCi].TravId == iVar8) goto LAB_004a8ec6;
  }
  pTVar3[iCi].TravId = iVar8;
  iVar9 = pTVar3[iCi].iObj2Box;
  if (-1 < (long)iVar9) {
    if (p->vBoxes->nSize <= iVar9) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    piVar4 = (int *)p->vBoxes->pArray[iVar9];
    if (piVar4 != (int *)0x0) {
      piVar4[1] = iVar8;
      if ((iVar6 != 0) && (iVar6 = piVar4[2], 0 < iVar6)) {
        lVar10 = 0;
        do {
          if (p->pCos == (Tim_Obj_t *)0x0) break;
          if (p->pCos[piVar4[lVar10 + 7]].TravId != p->nTravIds) {
            puts("Tim_ManGetCiArrival(): Input arrival times of the box are not up to date!");
            iVar6 = piVar4[2];
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar6);
      }
      pfVar7 = Tim_ManBoxDelayTable(p,*piVar4);
      iVar6 = piVar4[3];
      if ((0 < (long)iVar6) && (pTVar5 = p->pCis, pTVar5 != (Tim_Obj_t *)0x0)) {
        uVar2 = piVar4[2];
        pfVar7 = pfVar7 + 3;
        iVar8 = p->nTravIds;
        lVar10 = 0;
        do {
          fVar12 = -1e+09;
          if (0 < (int)uVar2) {
            uVar11 = 0;
            fVar12 = -1e+09;
            do {
              if (p->pCos == (Tim_Obj_t *)0x0) {
                fVar12 = -1e+09;
                break;
              }
              fVar1 = pfVar7[uVar11];
              if ((fVar1 != -1e+09) || (NAN(fVar1))) {
                iVar9 = (int)(fVar1 + p->pCos[piVar4[uVar11 + 7]].timeArr);
                if (iVar9 < (int)fVar12) {
                  iVar9 = (int)fVar12;
                }
                fVar12 = (float)iVar9;
              }
              uVar11 = uVar11 + 1;
            } while (uVar2 != uVar11);
          }
          iVar9 = piVar4[lVar10 + (int)uVar2 + 7];
          pTVar5[iVar9].timeArr = fVar12;
          pTVar5[iVar9].TravId = iVar8;
          lVar10 = lVar10 + 1;
          pfVar7 = pfVar7 + (int)uVar2;
        } while (lVar10 != iVar6);
      }
    }
  }
LAB_004a8ec6:
  return pTVar3[iCi].timeArr;
}

Assistant:

float Tim_ManGetCiArrival( Tim_Man_t * p, int iCi )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObjThis, * pObj, * pObjRes;
    float * pTable, * pDelays, DelayBest;
    int i, k;
    // consider the already processed PI
    pObjThis = Tim_ManCi( p, iCi );
    if ( p->fUseTravId && pObjThis->TravId == p->nTravIds )
        return pObjThis->timeArr;
    pObjThis->TravId = p->nTravIds;
    // consider the main PI
    pBox = Tim_ManCiBox( p, iCi );
    if ( pBox == NULL )
        return pObjThis->timeArr;
    // update box timing
    pBox->TravId = p->nTravIds;
    // get the arrival times of the inputs of the box (POs)
    if ( p->fUseTravId )
    Tim_ManBoxForEachInput( p, pBox, pObj, i )
        if ( pObj->TravId != p->nTravIds )
            printf( "Tim_ManGetCiArrival(): Input arrival times of the box are not up to date!\n" );
    // compute the arrival times for each output of the box (PIs)
    pTable = Tim_ManBoxDelayTable( p, pBox->iBox );
    Tim_ManBoxForEachOutput( p, pBox, pObjRes, i )
    {
        pDelays = pTable + 3 + i * pBox->nInputs;
        DelayBest = -TIM_ETERNITY;
        Tim_ManBoxForEachInput( p, pBox, pObj, k )
            if ( pDelays[k] != -ABC_INFINITY )
                DelayBest = Abc_MaxInt( DelayBest, pObj->timeArr + pDelays[k] );
        pObjRes->timeArr = DelayBest;
        pObjRes->TravId = p->nTravIds;
    }
    return pObjThis->timeArr;
}